

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O2

void htmlParsePI(htmlParserCtxtPtr ctxt)

{
  xmlChar **ppxVar1;
  int *piVar2;
  uint uVar3;
  xmlParserInputPtr pxVar4;
  processingInstructionSAXFunc p_Var5;
  uint val;
  int iVar6;
  xmlChar *pxVar7;
  xmlChar *pxVar8;
  ulong uVar9;
  xmlChar *pxVar10;
  xmlParserInputState xVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int l;
  xmlParserInputState local_4c;
  ulong local_48;
  int local_3c;
  xmlChar *local_38;
  
  if (ctxt->token != 0) {
    return;
  }
  pxVar4 = ctxt->input;
  pxVar7 = pxVar4->cur;
  if (*pxVar7 != '<') {
    return;
  }
  if (pxVar7[1] != '?') {
    return;
  }
  xVar11 = ctxt->instate;
  ctxt->instate = XML_PARSER_PI;
  pxVar7 = pxVar7 + 2;
  pxVar4->cur = pxVar7;
  pxVar4->col = pxVar4->col + 2;
  if ((500 < (long)pxVar7 - (long)pxVar4->base) && ((long)pxVar4->end - (long)pxVar7 < 500)) {
    xmlParserInputShrink(pxVar4);
  }
  pxVar7 = htmlParseName(ctxt);
  if (pxVar7 == (xmlChar *)0x0) {
    htmlParseErr(ctxt,XML_ERR_PI_NOT_STARTED,"PI is not started correctly",(xmlChar *)0x0,
                 (xmlChar *)0x0);
  }
  else {
    if (ctxt->token == 0) {
      pxVar4 = ctxt->input;
      if (*pxVar4->cur == '>') {
        pxVar4->cur = pxVar4->cur + 1;
        pxVar4->col = pxVar4->col + 1;
        if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
           (p_Var5 = ctxt->sax->processingInstruction, p_Var5 != (processingInstructionSAXFunc)0x0))
        {
          (*p_Var5)(ctxt->userData,pxVar7,(xmlChar *)0x0);
        }
        goto LAB_0014b75c;
      }
    }
    pxVar8 = (xmlChar *)(*xmlMallocAtomic)(100);
    if (pxVar8 == (xmlChar *)0x0) {
      htmlErrMemory(ctxt,(char *)0x0);
    }
    else {
      uVar9 = (ulong)*ctxt->input->cur;
      local_4c = xVar11;
      if ((0x20 < uVar9) ||
         (pxVar10 = (xmlChar *)0x100002600, (0x100002600U >> (uVar9 & 0x3f) & 1) == 0)) {
        pxVar10 = pxVar7;
        htmlParseErr(ctxt,XML_ERR_SPACE_REQUIRED,"ParsePI: PI %s space expected\n",pxVar7,
                     (xmlChar *)0x0);
      }
      local_38 = pxVar7;
      htmlSkipBlankChars(ctxt);
      val = htmlCurrentChar(ctxt,&l);
      local_48 = 0;
      iVar14 = 100;
      local_3c = 0;
      while( true ) {
        xVar11 = local_4c;
        iVar6 = (int)pxVar10;
        lVar13 = (long)(int)local_48;
        if ((val == 0) || (val == 0x3e)) break;
        pxVar7 = pxVar8;
        if (iVar14 <= (int)local_48 + 5) {
          iVar14 = iVar14 * 2;
          pxVar7 = (xmlChar *)(*xmlRealloc)(pxVar8,(long)iVar14);
          if (pxVar7 == (xmlChar *)0x0) {
            htmlErrMemory(ctxt,(char *)0x0);
            (*xmlFree)(pxVar8);
            xVar11 = local_4c;
            goto LAB_0014b75c;
          }
        }
        pxVar8 = pxVar7;
        if (local_3c < 0x32) {
          iVar12 = local_3c + 1;
        }
        else {
          iVar12 = 0;
          if ((ctxt->progressive == 0) &&
             (pxVar4 = ctxt->input, (long)pxVar4->end - (long)pxVar4->cur < 0xfa)) {
            xmlParserInputGrow(pxVar4,0xfa);
            iVar12 = 0;
          }
        }
        if ((int)val < 0x100) {
          if ((0x1f < (int)val) || ((val < 0xe && ((0x2600U >> (val & 0x1f) & 1) != 0))))
          goto LAB_0014b59b;
LAB_0014b5e5:
          htmlParseErrInt(ctxt,0x1eb84b,(char *)(ulong)val,iVar6);
        }
        else {
          uVar3 = val - 0xe000;
          iVar6 = CONCAT31((int3)(uVar3 >> 8),uVar3 < 0x1ffe || val < 0xd800);
          if (0xfffff < val - 0x10000 && (uVar3 >= 0x1ffe && val >= 0xd800)) goto LAB_0014b5e5;
LAB_0014b59b:
          if (l == 1) {
            local_48 = (ulong)((int)local_48 + 1);
            pxVar8[lVar13] = (xmlChar)val;
          }
          else {
            iVar6 = xmlCopyChar(l,pxVar8 + lVar13,val);
            local_48 = (ulong)(uint)(iVar6 + (int)local_48);
          }
        }
        pxVar4 = ctxt->input;
        pxVar10 = pxVar4->cur;
        if (*pxVar10 == '\n') {
          pxVar4->line = pxVar4->line + 1;
          pxVar4->col = 1;
        }
        else {
          pxVar4->col = pxVar4->col + 1;
        }
        ctxt->token = 0;
        pxVar10 = pxVar10 + l;
        pxVar4->cur = pxVar10;
        local_3c = iVar12;
        val = htmlCurrentChar(ctxt,&l);
        if (val == 0) {
          pxVar4 = ctxt->input;
          pxVar10 = pxVar4->cur + -(long)pxVar4->base;
          if ((500 < (long)pxVar10) &&
             (pxVar10 = pxVar4->end + -(long)pxVar4->cur, (long)pxVar10 < 500)) {
            xmlParserInputShrink(pxVar4);
          }
          if ((ctxt->progressive == 0) &&
             (pxVar4 = ctxt->input, (long)pxVar4->end - (long)pxVar4->cur < 0xfa)) {
            xmlParserInputGrow(pxVar4,0xfa);
          }
          val = htmlCurrentChar(ctxt,&l);
        }
      }
      pxVar8[lVar13] = '\0';
      if (val == 0x3e) {
        pxVar4 = ctxt->input;
        ppxVar1 = &pxVar4->cur;
        *ppxVar1 = *ppxVar1 + 1;
        piVar2 = &pxVar4->col;
        *piVar2 = *piVar2 + 1;
        if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
           (p_Var5 = ctxt->sax->processingInstruction, p_Var5 != (processingInstructionSAXFunc)0x0))
        {
          (*p_Var5)(ctxt->userData,local_38,pxVar8);
        }
      }
      else {
        htmlParseErr(ctxt,XML_ERR_PI_NOT_FINISHED,"ParsePI: PI %s never end ...\n",local_38,
                     (xmlChar *)0x0);
        xVar11 = local_4c;
      }
      (*xmlFree)(pxVar8);
    }
  }
LAB_0014b75c:
  ctxt->instate = xVar11;
  return;
}

Assistant:

static void
htmlParsePI(htmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = HTML_PARSER_BUFFER_SIZE;
    int cur, l;
    const xmlChar *target;
    xmlParserInputState state;
    int count = 0;

    if ((RAW == '<') && (NXT(1) == '?')) {
	state = ctxt->instate;
        ctxt->instate = XML_PARSER_PI;
	/*
	 * this is a Processing Instruction.
	 */
	SKIP(2);
	SHRINK;

	/*
	 * Parse the target name and check for special support like
	 * namespace.
	 */
        target = htmlParseName(ctxt);
	if (target != NULL) {
	    if (RAW == '>') {
		SKIP(1);

		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, NULL);
		ctxt->instate = state;
		return;
	    }
	    buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
	    if (buf == NULL) {
		htmlErrMemory(ctxt, NULL);
		ctxt->instate = state;
		return;
	    }
	    cur = CUR;
	    if (!IS_BLANK(cur)) {
		htmlParseErr(ctxt, XML_ERR_SPACE_REQUIRED,
			  "ParsePI: PI %s space expected\n", target, NULL);
	    }
            SKIP_BLANKS;
	    cur = CUR_CHAR(l);
	    while ((cur != 0) && (cur != '>')) {
		if (len + 5 >= size) {
		    xmlChar *tmp;

		    size *= 2;
		    tmp = (xmlChar *) xmlRealloc(buf, size * sizeof(xmlChar));
		    if (tmp == NULL) {
			htmlErrMemory(ctxt, NULL);
			xmlFree(buf);
			ctxt->instate = state;
			return;
		    }
		    buf = tmp;
		}
		count++;
		if (count > 50) {
		    GROW;
		    count = 0;
		}
                if (IS_CHAR(cur)) {
		    COPY_BUF(l,buf,len,cur);
                } else {
                    htmlParseErrInt(ctxt, XML_ERR_INVALID_CHAR,
                                    "Invalid char in processing instruction "
                                    "0x%X\n", cur);
                }
		NEXTL(l);
		cur = CUR_CHAR(l);
		if (cur == 0) {
		    SHRINK;
		    GROW;
		    cur = CUR_CHAR(l);
		}
	    }
	    buf[len] = 0;
	    if (cur != '>') {
		htmlParseErr(ctxt, XML_ERR_PI_NOT_FINISHED,
		      "ParsePI: PI %s never end ...\n", target, NULL);
	    } else {
		SKIP(1);

		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, buf);
	    }
	    xmlFree(buf);
	} else {
	    htmlParseErr(ctxt, XML_ERR_PI_NOT_STARTED,
                         "PI is not started correctly", NULL, NULL);
	}
	ctxt->instate = state;
    }
}